

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,int _elempack,
                 Allocator *_allocator)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 extraout_var;
  void *pvVar4;
  long lVar5;
  
  if ((((this->dims != 3) || (this->w != _w)) || (this->h != _h)) ||
     (((this->c != _c || (this->elemsize != _elemsize)) ||
      ((this->elempack != _elempack || (this->allocator != _allocator)))))) {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = _elempack;
    this->allocator = _allocator;
    this->dims = 3;
    this->w = _w;
    this->h = _h;
    this->d = 1;
    this->c = _c;
    uVar2 = (long)_h * (long)_w * _elemsize + 0xf & 0xfffffffffffffff0;
    uVar3 = uVar2 / _elemsize;
    this->cstep = uVar3;
    lVar5 = (long)_c * uVar3;
    if (lVar5 != 0) {
      uVar3 = lVar5 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar4 = fastMalloc(uVar3 + 4);
      }
      else {
        iVar1 = (*_allocator->_vptr_Allocator[2])(_allocator,uVar3 + 4,uVar2 % _elemsize);
        pvVar4 = (void *)CONCAT44(extraout_var,iVar1);
      }
      this->data = pvVar4;
      this->refcount = (int *)((long)pvVar4 + uVar3);
      *(undefined4 *)((long)pvVar4 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _c, size_t _elemsize, int _elempack, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && elempack == _elempack && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = _elempack;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    d = 1;
    c = _c;

    cstep = alignSize((size_t)w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}